

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_context * ggml_init(ggml_init_params params)

{
  ggml_context *pgVar1;
  void *pvVar2;
  long lVar3;
  void *pvVar4;
  int i;
  long lVar5;
  float *pfVar6;
  float fVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 extraout_var [56];
  
  pvVar4 = params.mem_buffer;
  ggml_critical_section_start();
  if (ggml_init_is_first_call != '\x01') {
    ggml_time_us();
    pfVar6 = table_f32_f16;
    for (lVar5 = 0; lVar5 != 0x10000; lVar5 = lVar5 + 1) {
      auVar9 = vcvtph2ps_f16c(ZEXT416((uint)lVar5));
      fVar7 = auVar9._0_4_;
      *pfVar6 = fVar7;
      auVar14._0_8_ = (double)fVar7;
      auVar14._8_8_ = auVar9._8_8_;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = auVar14._0_8_ * 0.044715;
      auVar9 = vfmadd213sd_fma(auVar12,auVar14,ZEXT816(0x3ff0000000000000));
      dVar8 = tanh(auVar14._0_8_ * 0.7978845608028654 * auVar9._0_8_);
      dVar8 = (dVar8 + 1.0) * auVar14._0_8_ * 0.5;
      auVar9._0_4_ = (float)dVar8;
      auVar9._4_4_ = (int)((ulong)dVar8 >> 0x20);
      auVar9._8_8_ = 0;
      auVar9 = vcvtps2ph_f16c(auVar9,0);
      vpextrw_avx(auVar9,0);
      dVar8 = exp((double)-fVar7);
      dVar8 = auVar14._0_8_ / (dVar8 + 1.0);
      auVar13._0_4_ = (float)dVar8;
      auVar13._4_4_ = (int)((ulong)dVar8 >> 0x20);
      auVar13._8_8_ = 0;
      auVar9 = vcvtps2ph_f16c(auVar13,0);
      vpextrw_avx(auVar9,0);
      auVar11._0_8_ = exp(auVar14._0_8_);
      auVar11._8_56_ = extraout_var;
      auVar10._0_4_ = (float)auVar11._0_8_;
      auVar10._4_12_ = auVar11._4_12_;
      auVar9 = vcvtps2ph_f16c(auVar10,0);
      vpextrw_avx(auVar9,0);
      pfVar6 = pfVar6 + 1;
    }
    ggml_time_us();
    ggml_time_us();
    memset(&g_state,0,0x1800);
    for (lVar5 = 0; lVar5 != 0x1800; lVar5 = lVar5 + 0x60) {
      (&g_state.contexts[0].used)[lVar5] = false;
    }
    ggml_time_us();
    ggml_init_is_first_call = '\x01';
  }
  pgVar1 = (ggml_context *)0x0;
  lVar5 = 0;
  do {
    lVar3 = lVar5;
    if (lVar3 + 0x60 == 0x1860) goto LAB_00117a29;
    lVar5 = lVar3 + 0x60;
  } while ((&g_state.contexts[0].used)[lVar3] != false);
  (&g_state.contexts[0].used)[lVar3] = true;
  pvVar2 = pvVar4;
  if (pvVar4 == (void *)0x0) {
    pvVar2 = malloc(params.mem_size);
  }
  pgVar1 = (ggml_context *)((long)&g_state.contexts[0].context.mem_size + lVar3);
  pgVar1->mem_size = params.mem_size;
  *(void **)((long)&g_state.contexts[0].context.mem_buffer + lVar3) = pvVar2;
  *(bool *)(lVar3 + 0x1d77a8) = pvVar4 == (void *)0x0;
  *(undefined8 *)(&g_state.contexts[0].context.field_0x11 + lVar3) = 0;
  *(undefined8 *)((long)&g_state.contexts[0].context.objects_begin + lVar3 + 1) = 0;
  *(undefined8 *)((long)&g_state.contexts[0].context.objects_end + lVar3 + 1) = 0;
  *(undefined8 *)((long)&g_state.contexts[0].context.scratch.offs + lVar3 + 1) = 0;
  *(undefined8 *)((long)&g_state.contexts[0].context.scratch.size + lVar3 + 1) = 0;
  *(undefined8 *)((long)&g_state.contexts[0].context.scratch.data + lVar3 + 1) = 0;
  *(undefined8 *)((long)&g_state.contexts[0].context.scratch_save.offs + lVar3 + 1) = 0;
  *(undefined8 *)((long)&g_state.contexts[0].context.scratch_save.size + lVar3 + 1) = 0;
  *(undefined8 *)((long)&g_state.contexts[0].context.scratch_save.data + lVar3) = 0;
LAB_00117a29:
  LOCK();
  g_state_barrier = g_state_barrier + -1;
  UNLOCK();
  return pgVar1;
}

Assistant:

struct ggml_context * ggml_init(struct ggml_init_params params) {
    // make this function thread safe
    ggml_critical_section_start();

    static bool is_first_call = true;

    if (is_first_call) {
        // initialize GELU, SILU and EXP F32 tables
        {
            const uint64_t t_start = ggml_time_us(); UNUSED(t_start);

            ggml_fp16_t ii;
            for (int i = 0; i < (1 << 16); ++i) {
                uint16_t ui = i;
                memcpy(&ii, &ui, sizeof(ii));
                const float f = table_f32_f16[i] = GGML_COMPUTE_FP16_TO_FP32(ii);
                table_gelu_f16[i] = GGML_FP32_TO_FP16(ggml_gelu_f32(f));
                table_silu_f16[i] = GGML_FP32_TO_FP16(ggml_silu_f32(f));
                table_exp_f16[i]  = GGML_FP32_TO_FP16(exp(f));
            }

            const uint64_t t_end = ggml_time_us(); UNUSED(t_end);

            GGML_PRINT_DEBUG("%s: GELU, SILU and EXP tables initialized in %f ms\n", __func__, (t_end - t_start)/1000.0f);
        }

        // initialize g_state
        {
            const uint64_t t_start = ggml_time_us(); UNUSED(t_start);

            g_state = (struct ggml_state) {
                /*.contexts =*/ { { 0 } },
            };

            for (int i = 0; i < GGML_MAX_CONTEXTS; ++i) {
                g_state.contexts[i].used = false;
            }

            const uint64_t t_end = ggml_time_us(); UNUSED(t_end);

            GGML_PRINT_DEBUG("%s: g_state initialized in %f ms\n", __func__, (t_end - t_start)/1000.0f);
        }

        is_first_call = false;
    }

    // find non-used context in g_state
    struct ggml_context * ctx = NULL;

    for (int i = 0; i < GGML_MAX_CONTEXTS; i++) {
        if (!g_state.contexts[i].used) {
            g_state.contexts[i].used = true;
            ctx = &g_state.contexts[i].context;

            GGML_PRINT_DEBUG("%s: found unused context %d\n", __func__, i);
            break;
        }
    }

    if (ctx == NULL) {
        GGML_PRINT_DEBUG("%s: no unused context found\n", __func__);

        ggml_critical_section_end();

        return NULL;
    }

    *ctx = (struct ggml_context) {
        /*.mem_size         =*/ params.mem_size,
        /*.mem_buffer       =*/ params.mem_buffer ? params.mem_buffer : malloc(params.mem_size),
        /*.mem_buffer_owned =*/ params.mem_buffer ? false : true,
        /*.n_objects        =*/ 0,
        /*.objects_begin    =*/ NULL,
        /*.objects_end      =*/ NULL,
        /*.scratch          =*/ { 0, 0, NULL, },
        /*.scratch_save     =*/ { 0, 0, NULL, },
    };

    ggml_assert_aligned(ctx->mem_buffer);

    GGML_PRINT_DEBUG("%s: context initialized\n", __func__);

    ggml_critical_section_end();

    return ctx;
}